

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::fillStencilData
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  GLubyte *__s;
  CubeMapArrayDataStorage *pCVar1;
  GLuint x;
  uint uVar2;
  uint uVar3;
  CubeMapArrayDataStorage *pCVar4;
  uint uVar5;
  
  pCVar1 = this->m_cube_map_array_data;
  __s = pCVar1[test_index].m_data_array;
  memset(__s,0,(ulong)(pCVar1[test_index].m_width * pCVar1[test_index].m_height *
                       pCVar1[test_index].m_depth * 4));
  pCVar1 = this->m_cube_map_array_data;
  pCVar4 = pCVar1;
  for (uVar5 = 0; uVar5 < pCVar4[test_index].m_depth; uVar5 = uVar5 + 1) {
    for (uVar2 = 0; uVar2 < pCVar4[test_index].m_width; uVar2 = uVar2 + 1) {
      for (uVar3 = pCVar4[test_index].m_height >> 1; uVar3 < pCVar1[test_index].m_height;
          uVar3 = uVar3 + 1) {
        builtin_memcpy(__s + ((pCVar1[test_index].m_width * uVar5 + uVar3) *
                              pCVar1[test_index].m_height + uVar2) * 4,"\x01\x01\x01\x01",4);
        pCVar1 = this->m_cube_map_array_data;
      }
      pCVar4 = pCVar1;
    }
  }
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::fillStencilData(glw::GLuint test_index)
{
	glw::GLubyte* const data = m_cube_map_array_data[test_index].getDataArray();

	memset(data, 0, m_cube_map_array_data[test_index].getArraySize() * sizeof(glw::GLubyte));

	for (glw::GLuint depth_index = 0; depth_index < m_cube_map_array_data[test_index].getDepth(); depth_index++)
	{
		for (glw::GLuint x = 0; x < m_cube_map_array_data[test_index].getWidth(); x++)
		{
			for (glw::GLuint y = m_cube_map_array_data[test_index].getHeight() / 2;
				 y < m_cube_map_array_data[test_index].getHeight(); y++)
			{
				glw::GLuint depth_position_in_array = m_cube_map_array_data[test_index].getWidth() *
													  m_cube_map_array_data[test_index].getHeight() * m_n_components *
													  depth_index;

				glw::GLuint y_position_in_array = m_cube_map_array_data[test_index].getHeight() * m_n_components * y;

				glw::GLuint x_position_in_array = m_n_components * x;

				glw::GLuint index_array = depth_position_in_array + y_position_in_array + x_position_in_array;

				memset((data + index_array), 1, m_n_components);

			} /* for (all rows) */
		}	 /* for (all columns) */
	}		  /* for (all layers) */
}